

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O2

void __thiscall QDecompressHelper::feed(QDecompressHelper *this,QByteArray *data)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (data->d).d;
  local_28.ptr = (data->d).ptr;
  local_28.size = (data->d).size;
  if (local_28.d != (Data *)0x0) {
    LOCK();
    ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  feed(this,(QByteArray *)&local_28);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDecompressHelper::feed(const QByteArray &data)
{
    return feed(QByteArray(data));
}